

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall helics::CoreBroker::fedRegistration(CoreBroker *this,ActionMessage *command)

{
  string_view name;
  string_view searchValue;
  string_view searchValue_00;
  string_view searchValue_01;
  string_view searchValue_02;
  string_view fmt;
  string_view message;
  byte bVar1;
  bool bVar2;
  BrokerState BVar3;
  int iVar4;
  int32_t val;
  __int_type_conflict _Var5;
  pointer pBVar6;
  BasicFedInfo *pBVar7;
  size_type sVar8;
  pointer ppVar9;
  pointer pBVar10;
  ActionMessage *in_RSI;
  CoreBroker *in_RDI;
  optional<unsigned_long> oVar11;
  pair<std::__detail::_Node_iterator<std::pair<const_helics::GlobalFederateId,_helics::route_id>,_false,_false>,_bool>
  pVar12;
  __sv_type args;
  ActionMessage timeBarrier;
  ActionMessage fedEnableProfiling;
  ActionMessage fedReply;
  pair<std::__detail::_Node_iterator<std::pair<const_helics::GlobalFederateId,_helics::route_id>,_false,_false>,_bool>
  res;
  GlobalFederateId global_fedid;
  route_id route_id;
  size_type lookupIndex;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  fedLoc;
  bool newFed;
  string_view fedName;
  bool allowed;
  ActionMessage noInit;
  bool dynamicFed;
  bool countable;
  value_type *in_stack_fffffffffffff9d8;
  ActionMessage *in_stack_fffffffffffff9e0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffff9e8;
  undefined4 in_stack_fffffffffffff9f0;
  action_t in_stack_fffffffffffff9f4;
  CoreBroker *in_stack_fffffffffffff9f8;
  ActionMessage *this_00;
  GlobalFederateId in_stack_fffffffffffffa00;
  GlobalFederateId in_stack_fffffffffffffa04;
  CoreBroker *in_stack_fffffffffffffa08;
  GlobalFederateId *in_stack_fffffffffffffa10;
  undefined6 in_stack_fffffffffffffa18;
  undefined1 in_stack_fffffffffffffa1e;
  undefined1 in_stack_fffffffffffffa1f;
  SimpleQueue<helics::ActionMessage,_std::mutex> *in_stack_fffffffffffffa20;
  GlobalFederateId *local_5d8;
  route_id *local_5d0;
  bool local_5b1;
  GlobalFederateId local_594;
  undefined1 local_590 [4];
  BaseType local_58c;
  baseType local_570;
  int32_t in_stack_fffffffffffffae4;
  ActionMessage *in_stack_fffffffffffffae8;
  CoreBroker *in_stack_fffffffffffffaf0;
  TimeRepresentation<count_time<9,_long>_> local_4d8;
  uint local_4d0;
  uint local_4cc;
  undefined4 in_stack_fffffffffffffb38;
  undefined1 fromRemote;
  GlobalFederateId in_stack_fffffffffffffb3c;
  BrokerBase *in_stack_fffffffffffffb40;
  string_view in_stack_fffffffffffffb48;
  GlobalFederateId in_stack_fffffffffffffb5c;
  BaseType local_408;
  BaseType local_404;
  char *local_400;
  undefined8 local_3f8;
  undefined1 local_3f0 [32];
  __sv_type local_3d0;
  GlobalBrokerId id;
  GlobalFederateId in_stack_fffffffffffffc54;
  route_id rVar13;
  GlobalFederateId in_stack_fffffffffffffc5c;
  GlobalFederateId local_384;
  undefined8 in_stack_fffffffffffffc80;
  GlobalFederateId GVar14;
  InterfaceHandle in_stack_fffffffffffffc8c;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  local_298;
  GlobalFederateId local_28c;
  size_t local_288;
  char *local_280;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  local_278;
  route_id local_26c;
  undefined4 local_268;
  BaseType local_264;
  GlobalFederateId local_260;
  GlobalFederateId local_25c;
  GlobalFederateId local_258;
  GlobalFederateId local_254;
  long local_250;
  BaseType local_244;
  BaseType local_240;
  BaseType local_23c;
  _Storage<unsigned_long,_true> local_238;
  undefined1 local_230;
  size_t local_220;
  char *local_218;
  BasicFedInfo *local_210;
  size_t local_208;
  char *local_200;
  BasicFedInfo *local_1f8;
  BaseType local_1ec;
  BaseType local_1e8;
  BaseType local_1e4;
  BasicFedInfo *local_1e0;
  size_t local_1d8;
  char *local_1d0;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  local_1c8;
  byte local_1b9;
  string_view local_1b8;
  bool local_1a5;
  undefined4 local_194;
  BaseType local_190;
  GlobalFederateId local_18c;
  undefined1 local_188 [8];
  BaseType local_180;
  byte local_ca;
  byte local_c9;
  ActionMessage *local_c8;
  undefined1 local_b8 [16];
  BaseType local_a8 [4];
  BaseType local_98 [4];
  undefined8 local_88;
  undefined1 *local_80;
  char *local_78;
  undefined8 uStack_70;
  BaseType *local_60;
  BaseType *local_58;
  string_view *local_50;
  char *local_48;
  undefined8 uStack_40;
  undefined1 *local_38;
  BaseType local_2c;
  BaseType *local_28;
  BaseType local_1c;
  BaseType *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  fromRemote = (undefined1)((uint)in_stack_fffffffffffffb38 >> 0x18);
  if (((in_RDI->super_BrokerBase).field_0x295 & 1) == 0) {
    std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
              ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
               in_stack_fffffffffffff9e0,in_stack_fffffffffffff9d8);
  }
  else {
    local_c8 = in_RSI;
    bVar2 = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>(in_RSI,non_counting_flag)
    ;
    local_c9 = (bVar2 ^ 0xffU) & 1;
    local_ca = 0;
    if ((local_c9 == 0) ||
       (iVar4 = getCountableFederates
                          ((CoreBroker *)
                           CONCAT44(in_stack_fffffffffffffa04.gid,in_stack_fffffffffffffa00.gid)),
       iVar4 < (in_RDI->super_BrokerBase).maxFederateCount)) {
      BVar3 = BrokerBase::getBrokerState((BrokerBase *)0x5d2fea);
      if (BVar3 < OPERATING) {
        if (((local_c9 & 1) != 0) && (bVar2 = allInitReady(in_stack_fffffffffffffa08), bVar2)) {
          ActionMessage::ActionMessage
                    ((ActionMessage *)
                     CONCAT44(in_stack_fffffffffffffa04.gid,in_stack_fffffffffffffa00.gid),
                     (action_t)((ulong)in_stack_fffffffffffff9f8 >> 0x20));
          local_190 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
          GlobalFederateId::GlobalFederateId(&local_18c,(GlobalBrokerId)local_190);
          local_180 = local_18c.gid;
          local_194 = 0;
          (*(in_RDI->super_Broker)._vptr_Broker[0x22])(in_RDI,0,local_188);
          ActionMessage::~ActionMessage(in_stack_fffffffffffff9e0);
        }
      }
      else {
        BVar3 = BrokerBase::getBrokerState((BrokerBase *)0x5d30db);
        if (BVar3 != OPERATING) {
          sendFedErrorAck(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                          in_stack_fffffffffffffae4);
          return;
        }
        local_5b1 = true;
        if ((((in_RDI->super_BrokerBase).dynamicFederation & 1U) == 0) &&
           (local_5b1 = true, (local_c9 & 1) != 0)) {
          local_5b1 = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                                (local_c8,observer_flag);
        }
        local_1a5 = local_5b1;
        if (local_5b1 == false) {
          sendFedErrorAck(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                          in_stack_fffffffffffffae4);
          return;
        }
        local_ca = 1;
      }
      local_1b8 = ActionMessage::name((ActionMessage *)0x5d318c);
      local_1b9 = 1;
      if (((local_ca & 1) != 0) &&
         (bVar2 = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                            (local_c8,reentrant_flag), bVar2)) {
        local_1d8 = local_1b8._M_len;
        local_1d0 = local_1b8._M_str;
        searchValue._M_len._4_4_ = in_stack_fffffffffffffa04.gid;
        searchValue._M_len._0_4_ = in_stack_fffffffffffffa00.gid;
        searchValue._M_str = (char *)in_stack_fffffffffffffa08;
        local_1c8 = gmlc::containers::
                    DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                    ::find((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                            *)in_stack_fffffffffffff9f8,searchValue);
        local_1e0 = (BasicFedInfo *)
                    gmlc::containers::
                    DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                    ::end((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                           *)in_stack_fffffffffffff9d8);
        bVar2 = __gnu_cxx::
                operator==<helics::BasicFedInfo_*,_const_helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                          ((__normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                            *)in_stack_fffffffffffff9e0,
                           (__normal_iterator<const_helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                            *)in_stack_fffffffffffff9d8);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          pBVar6 = __gnu_cxx::
                   __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                   ::operator->(&local_1c8);
          if ((pBVar6->reentrant & 1U) == 0) {
            sendFedErrorAck(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                            in_stack_fffffffffffffae4);
            return;
          }
          local_1e8 = (local_c8->source_id).gid;
          local_1e4 = (BaseType)getRoute(in_stack_fffffffffffff9f8,in_stack_fffffffffffffa00);
          pBVar6 = __gnu_cxx::
                   __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                   ::operator->(&local_1c8);
          (pBVar6->route).rid = local_1e4;
          local_1ec = (BaseType)
                      GlobalFederateId::operator_cast_to_GlobalBrokerId
                                ((GlobalFederateId *)in_stack_fffffffffffff9d8);
          pBVar6 = __gnu_cxx::
                   __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                   ::operator->(&local_1c8);
          (pBVar6->parent).gid = local_1ec;
          pBVar6 = __gnu_cxx::
                   __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                   ::operator->(&local_1c8);
          pBVar6->state = CONNECTED;
          local_1b9 = 0;
        }
      }
      if ((local_1b9 & 1) != 0) {
        local_208 = local_1b8._M_len;
        local_200 = local_1b8._M_str;
        searchValue_00._M_len._4_4_ = in_stack_fffffffffffffa04.gid;
        searchValue_00._M_len._0_4_ = in_stack_fffffffffffffa00.gid;
        searchValue_00._M_str = (char *)in_stack_fffffffffffffa08;
        local_1f8 = (BasicFedInfo *)
                    gmlc::containers::
                    DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                    ::find((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                            *)in_stack_fffffffffffff9f8,searchValue_00);
        local_210 = (BasicFedInfo *)
                    gmlc::containers::
                    DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                    ::end((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                           *)in_stack_fffffffffffff9d8);
        bVar2 = __gnu_cxx::
                operator==<helics::BasicFedInfo_*,_const_helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                          ((__normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                            *)in_stack_fffffffffffff9e0,
                           (__normal_iterator<const_helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                            *)in_stack_fffffffffffff9d8);
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          sendFedErrorAck(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                          in_stack_fffffffffffffae4);
          return;
        }
        local_220 = local_1b8._M_len;
        local_218 = local_1b8._M_str;
        oVar11 = gmlc::containers::
                 DualStringMappedVector<helics::BasicFedInfo,helics::GlobalFederateId,(reference_stability)1,5>
                 ::insert<std::basic_string_view<char,std::char_traits<char>>&>
                           (&in_RDI->mFederates,local_1b8._M_len,local_1b8._M_str,&local_1b8);
        local_238._M_value =
             oVar11.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_payload;
        local_230 = oVar11.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                    super__Optional_payload_base<unsigned_long>._M_engaged;
        local_240 = (local_c8->source_id).gid;
        local_23c = (BaseType)getRoute(in_stack_fffffffffffff9f8,in_stack_fffffffffffffa00);
        pBVar7 = gmlc::containers::
                 DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                 ::back((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                         *)0x5d346b);
        (pBVar7->route).rid = local_23c;
        local_244 = (BaseType)
                    GlobalFederateId::operator_cast_to_GlobalBrokerId
                              ((GlobalFederateId *)in_stack_fffffffffffff9d8);
        pBVar7 = gmlc::containers::
                 DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                 ::back((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                         *)0x5d34a1);
        (pBVar7->parent).gid = local_244;
        bVar2 = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                          (local_c8,non_counting_flag);
        if (bVar2) {
          pBVar7 = gmlc::containers::
                   DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                   ::back((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                           *)0x5d34d7);
          pBVar7->nonCounting = true;
        }
        bVar2 = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                          (local_c8,observer_flag);
        if (bVar2) {
          pBVar7 = gmlc::containers::
                   DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                   ::back((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                           *)0x5d3507);
          pBVar7->observer = true;
        }
        bVar2 = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                          (local_c8,reentrant_flag);
        if (bVar2) {
          pBVar7 = gmlc::containers::
                   DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                   ::back((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                           *)0x5d3537);
          pBVar7->reentrant = true;
        }
        bVar1 = local_ca;
        pBVar7 = gmlc::containers::
                 DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                 ::back((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                         *)0x5d355a);
        pBVar7->dynamic = (bool)(bVar1 & 1);
        sVar8 = gmlc::containers::
                DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                ::size((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                        *)0x5d3578);
        local_250 = sVar8 - 1;
        bVar2 = checkActionFlag<helics::ActionMessage,helics::TimingFlags>(local_c8,child_flag);
        if (bVar2) {
          val = ActionMessage::getExtraData((ActionMessage *)0x5d35ac);
          GlobalFederateId::GlobalFederateId(&local_254,val);
          pBVar7 = gmlc::containers::
                   DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                   ::back((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                           *)0x5d35cf);
          (pBVar7->global_id).gid = local_254.gid;
          gmlc::containers::
          DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
          ::back((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                  *)0x5d35fb);
          bVar2 = gmlc::containers::
                  DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                  ::addSearchTermForIndex
                            ((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                              *)CONCAT17(in_stack_fffffffffffffa1f,
                                         CONCAT16(in_stack_fffffffffffffa1e,
                                                  in_stack_fffffffffffffa18)),
                             in_stack_fffffffffffffa10,(size_t)in_stack_fffffffffffffa08);
          if (!bVar2) {
            sendFedErrorAck(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                            in_stack_fffffffffffffae4);
            return;
          }
        }
        else if (((in_RDI->super_BrokerBase).field_0x294 & 1) != 0) {
          if ((local_c8->counter == 0) || (0x10 < local_c8->counter)) {
            GlobalFederateId::GlobalFederateId(&local_25c,(int)local_250 + 0x20000);
            pBVar7 = gmlc::containers::
                     DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                     ::back((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                             *)0x5d36f5);
            (pBVar7->global_id).gid = local_25c.gid;
          }
          else {
            GlobalFederateId::GlobalFederateId
                      (&local_258,(int)local_250 + 0x20000 + (uint)local_c8->counter * 100000000);
            pBVar7 = gmlc::containers::
                     DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                     ::back((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                             *)0x5d36b8);
            (pBVar7->global_id).gid = local_258.gid;
          }
          gmlc::containers::
          DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
          ::back((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                  *)0x5d3721);
          gmlc::containers::
          DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
          ::addSearchTermForIndex
                    ((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                      *)CONCAT17(in_stack_fffffffffffffa1f,
                                 CONCAT16(in_stack_fffffffffffffa1e,in_stack_fffffffffffffa18)),
                     in_stack_fffffffffffffa10,(size_t)in_stack_fffffffffffffa08);
        }
      }
      if (((in_RDI->super_BrokerBase).field_0x294 & 1) == 0) {
        bVar2 = GlobalBrokerId::isValid(&(in_RDI->super_BrokerBase).global_broker_id_local);
        if (bVar2) {
          local_264 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
          GlobalFederateId::GlobalFederateId(&local_260,(GlobalBrokerId)local_264);
          (local_c8->source_id).gid = local_260.gid;
          local_268 = 0;
          (*(in_RDI->super_Broker)._vptr_Broker[0x22])(in_RDI,0,local_c8);
        }
        else {
          gmlc::containers::SimpleQueue<helics::ActionMessage,std::mutex>::
          push<helics::ActionMessage&>
                    (in_stack_fffffffffffffa20,
                     (ActionMessage *)
                     CONCAT17(in_stack_fffffffffffffa1f,
                              CONCAT16(in_stack_fffffffffffffa1e,in_stack_fffffffffffffa18)));
        }
      }
      else {
        if ((local_1b9 & 1) == 0) {
          local_288 = local_1b8._M_len;
          local_280 = local_1b8._M_str;
          searchValue_01._M_len._4_4_ = in_stack_fffffffffffffa04.gid;
          searchValue_01._M_len._0_4_ = in_stack_fffffffffffffa00.gid;
          searchValue_01._M_str = (char *)in_stack_fffffffffffffa08;
          local_278 = gmlc::containers::
                      DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                      ::find((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                              *)in_stack_fffffffffffff9f8,searchValue_01);
          pBVar7 = __gnu_cxx::
                   __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                   ::operator->(&local_278);
        }
        else {
          pBVar7 = gmlc::containers::
                   DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                   ::back((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                           *)0x5d3814);
        }
        local_5d0 = &pBVar7->route;
        local_26c.rid = local_5d0->rid;
        if ((local_1b9 & 1) == 0) {
          searchValue_02._M_len._4_4_ = in_stack_fffffffffffffa04.gid;
          searchValue_02._M_len._0_4_ = in_stack_fffffffffffffa00.gid;
          searchValue_02._M_str = (char *)in_stack_fffffffffffffa08;
          local_298 = gmlc::containers::
                      DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                      ::find((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                              *)in_stack_fffffffffffff9f8,searchValue_02);
          pBVar7 = __gnu_cxx::
                   __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
                   ::operator->(&local_298);
        }
        else {
          pBVar7 = gmlc::containers::
                   DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                   ::back((DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
                           *)0x5d38ad);
        }
        local_5d8 = &pBVar7->global_id;
        local_28c.gid = local_5d8->gid;
        pVar12 = std::
                 unordered_map<helics::GlobalFederateId,helics::route_id,std::hash<helics::GlobalFederateId>,std::equal_to<helics::GlobalFederateId>,std::allocator<std::pair<helics::GlobalFederateId_const,helics::route_id>>>
                 ::emplace<helics::GlobalFederateId&,helics::route_id&>
                           ((unordered_map<helics::GlobalFederateId,_helics::route_id,_std::hash<helics::GlobalFederateId>,_std::equal_to<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_helics::route_id>_>_>
                             *)CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                            (GlobalFederateId *)in_stack_fffffffffffff9e8,
                            (route_id *)in_stack_fffffffffffff9e0);
        if ((((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           ((local_1b9 & 1) == 0)) {
          ppVar9 = CLI::std::__detail::
                   _Node_iterator<std::pair<const_helics::GlobalFederateId,_helics::route_id>,_false,_false>
                   ::operator->((_Node_iterator<std::pair<const_helics::GlobalFederateId,_helics::route_id>,_false,_false>
                                 *)0x5d399a);
          (ppVar9->second).rid = local_26c.rid;
        }
        ActionMessage::ActionMessage
                  ((ActionMessage *)
                   CONCAT44(in_stack_fffffffffffffa04.gid,in_stack_fffffffffffffa00.gid),
                   (action_t)((ulong)in_stack_fffffffffffff9f8 >> 0x20));
        GlobalFederateId::GlobalFederateId
                  (&local_384,(GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid)
        ;
        name._M_str = (char *)in_stack_fffffffffffff9e0;
        name._M_len = (size_t)in_stack_fffffffffffff9d8;
        ActionMessage::name((ActionMessage *)0x5d3a27,name);
        bVar2 = checkActionFlag<helics::ActionMessage,helics::TimingFlags>(local_c8,child_flag);
        GVar14.gid = local_384.gid;
        if (bVar2) {
          setActionFlag<helics::ActionMessage,helics::TimingFlags>
                    ((ActionMessage *)&stack0xfffffffffffffc80,child_flag);
          GVar14.gid = local_384.gid;
        }
        if ((((in_RDI->super_BrokerBase).globalTime & 1U) != 0) ||
           (((in_RDI->super_BrokerBase).asyncTime & 1U) != 0)) {
          setActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                    ((ActionMessage *)&stack0xfffffffffffffc80,global_timing_flag);
          if (((in_RDI->super_BrokerBase).asyncTime & 1U) != 0) {
            setActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                      ((ActionMessage *)&stack0xfffffffffffffc80,async_timing_flag);
          }
          bVar2 = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                            (local_c8,non_counting_flag);
          if (!bVar2) {
            pBVar10 = CLI::std::
                      unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                      ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                    *)0x5d3b15);
            (*pBVar10->_vptr_BaseTimeCoordinator[4])(pBVar10,(ulong)(uint)local_28c.gid);
            pBVar10 = CLI::std::
                      unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                      ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                    *)0x5d3b4c);
            (*pBVar10->_vptr_BaseTimeCoordinator[5])(pBVar10,(ulong)(uint)local_28c.gid);
            CLI::std::
            unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
            ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                          *)0x5d3b83);
            in_stack_fffffffffffffc5c.gid = local_28c.gid;
            BaseTimeCoordinator::setAsChild
                      ((BaseTimeCoordinator *)in_stack_fffffffffffff9f8,in_stack_fffffffffffffa04);
          }
        }
        if (((in_RDI->super_BrokerBase).globalDisconnect & 1U) != 0) {
          setActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                    ((ActionMessage *)&stack0xfffffffffffffc80,global_disconnect_flag);
        }
        rVar13.rid = local_26c.rid;
        (*(in_RDI->super_Broker)._vptr_Broker[0x22])
                  (in_RDI,(ulong)(uint)local_26c.rid,&stack0xfffffffffffffc80);
        _Var5 = std::__atomic_base::operator_cast_to_int
                          ((__atomic_base<int> *)in_stack_fffffffffffff9e8);
        if (8 < _Var5) {
          id.gid = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
          GlobalFederateId::GlobalFederateId((GlobalFederateId *)&stack0xfffffffffffffc54,id);
          getIdentifier_abi_cxx11_(in_RDI);
          args = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff9e0);
          local_400 = "registering federate {}({}) on route {}";
          local_3f8 = 0x27;
          in_stack_fffffffffffffa04.gid = GlobalFederateId::baseValue(&local_28c);
          local_404 = in_stack_fffffffffffffa04.gid;
          in_stack_fffffffffffffa00.gid = helics::route_id::baseValue(&local_26c);
          local_38 = local_3f0;
          local_48 = local_400;
          uStack_40 = local_3f8;
          local_50 = &local_1b8;
          local_58 = &local_404;
          local_60 = &local_408;
          local_78 = local_400;
          uStack_70 = local_3f8;
          local_408 = in_stack_fffffffffffffa00.gid;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)
                     CONCAT44(in_stack_fffffffffffff9f4,in_stack_fffffffffffff9f0),
                     in_stack_fffffffffffff9e8);
          local_18 = local_a8;
          local_1c = *local_58;
          local_28 = local_98;
          local_2c = *local_60;
          local_8 = &local_88;
          local_10 = local_b8;
          local_88 = 0x11d;
          fmt.data_._4_4_ = in_stack_fffffffffffffc54.gid;
          fmt.data_._0_4_ = id.gid;
          fmt.size_._0_4_ = rVar13.rid;
          fmt.size_._4_4_ = in_stack_fffffffffffffc5c.gid;
          local_a8[0] = local_1c;
          local_98[0] = local_2c;
          local_80 = local_10;
          ::fmt::v11::vformat_abi_cxx11_(fmt,(format_args)args);
          local_3d0 = std::__cxx11::string::operator_cast_to_basic_string_view
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff9e0);
          message._M_str._0_4_ = GVar14.gid;
          message._M_len._0_4_ = (action_t)in_stack_fffffffffffffc80;
          message._M_len._4_4_ = SUB84(in_stack_fffffffffffffc80,4);
          message._M_str._4_4_ = in_stack_fffffffffffffc8c.hid;
          in_stack_fffffffffffff9e0 = (ActionMessage *)local_3d0._M_str;
          BrokerBase::sendToLogger
                    (in_stack_fffffffffffffb40,in_stack_fffffffffffffb5c,
                     in_stack_fffffffffffffb3c.gid,in_stack_fffffffffffffb48,message,
                     (bool)fromRemote);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff9e0);
        }
        if (((in_RDI->super_BrokerBase).enable_profiling & 1U) != 0) {
          GlobalFederateId::GlobalFederateId
                    ((GlobalFederateId *)&stack0xfffffffffffffb3c,
                     (GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid);
          local_4cc = local_28c.gid;
          ActionMessage::ActionMessage
                    ((ActionMessage *)in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f4,
                     in_stack_fffffffffffffa04,in_stack_fffffffffffffa00);
          setActionFlag<helics::ActionMessage,helics::GeneralFlags>
                    ((ActionMessage *)&stack0xfffffffffffffb40,indicator_flag);
          local_4d0 = local_26c.rid;
          (*(in_RDI->super_Broker)._vptr_Broker[0x22])
                    (in_RDI,(ulong)(uint)local_26c.rid,&stack0xfffffffffffffb40);
          ActionMessage::~ActionMessage(in_stack_fffffffffffff9e0);
        }
        this_00 = (ActionMessage *)&in_RDI->mNextTimeBarrier;
        local_4d8 = TimeRepresentation<count_time<9,_long>_>::maxVal();
        bVar2 = TimeRepresentation<count_time<9,_long>_>::operator<
                          ((TimeRepresentation<count_time<9,_long>_> *)this_00,&local_4d8);
        if (bVar2) {
          GlobalFederateId::GlobalFederateId
                    (&local_594,
                     (GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid);
          ActionMessage::ActionMessage
                    (this_00,in_stack_fffffffffffff9f4,in_stack_fffffffffffffa04,
                     in_stack_fffffffffffffa00);
          local_570 = (in_RDI->mNextTimeBarrier).internalTimeCode;
          local_58c = GlobalBrokerId::baseValue(&(in_RDI->super_BrokerBase).global_broker_id_local);
          (*(in_RDI->super_Broker)._vptr_Broker[0x22])(in_RDI,(ulong)(uint)local_26c.rid,local_590);
          ActionMessage::~ActionMessage(in_stack_fffffffffffff9e0);
        }
        ActionMessage::~ActionMessage(in_stack_fffffffffffff9e0);
      }
    }
    else {
      sendFedErrorAck(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,in_stack_fffffffffffffae4)
      ;
    }
  }
  return;
}

Assistant:

void CoreBroker::fedRegistration(ActionMessage&& command)
{
    if (!connectionEstablished) {
        earlyMessages.push_back(std::move(command));
        return;
    }
    const bool countable = !checkActionFlag(command, non_counting_flag);
    bool dynamicFed{false};
    if (countable && getCountableFederates() >= maxFederateCount) {
        sendFedErrorAck(command, max_federate_count_exceeded);
        return;
    }
    if (getBrokerState() < BrokerState::OPERATING) {
        if (countable && allInitReady()) {
            ActionMessage noInit(CMD_INIT_NOT_READY);
            noInit.source_id = global_broker_id_local;
            transmit(parent_route_id, noInit);
        }
    } else if (getBrokerState() == BrokerState::OPERATING) {
        const bool allowed =
            dynamicFederation || !countable || checkActionFlag(command, observer_flag);
        if (!allowed) {
            // we are initialized already
            sendFedErrorAck(command, already_init_error_code);
            return;
        }
        dynamicFed = true;
    } else {
        // we are in an ERROR_STATE and terminating
        sendFedErrorAck(command, broker_terminating);
        return;
    }
    auto fedName = command.name();
    bool newFed{true};
    if (dynamicFed && checkActionFlag(command, reentrant_flag)) {
        auto fedLoc = mFederates.find(fedName);
        if (fedLoc != mFederates.end()) {
            if (fedLoc->reentrant) {
                fedLoc->route = getRoute(command.source_id);
                fedLoc->parent = command.source_id;
                fedLoc->state = ConnectionState::CONNECTED;
                newFed = false;
            } else {
                sendFedErrorAck(command, duplicate_federate_name_error_code);
                return;
            }
        }
    }

    if (newFed) {
        // this checks for duplicate federate names
        if (mFederates.find(fedName) != mFederates.end()) {
            sendFedErrorAck(command, duplicate_federate_name_error_code);
            return;
        }
        mFederates.insert(fedName, no_search, fedName);
        mFederates.back().route = getRoute(command.source_id);
        mFederates.back().parent = command.source_id;
        if (checkActionFlag(command, non_counting_flag)) {
            mFederates.back().nonCounting = true;
        }
        if (checkActionFlag(command, observer_flag)) {
            mFederates.back().observer = true;
        }
        if (checkActionFlag(command, reentrant_flag)) {
            mFederates.back().reentrant = true;
        }
        mFederates.back().dynamic = dynamicFed;
        auto lookupIndex = mFederates.size() - 1;
        if (checkActionFlag(command, child_flag)) {
            mFederates.back().global_id = GlobalFederateId(command.getExtraData());
            if (!mFederates.addSearchTermForIndex(mFederates.back().global_id, lookupIndex)) {
                sendFedErrorAck(command, duplicate_federate_id);
                return;
            }
        } else if (isRootc) {
            if (command.counter > 0 && command.counter <= 16) {
                mFederates.back().global_id = GlobalFederateId(
                    static_cast<GlobalFederateId::BaseType>(lookupIndex) + gGlobalFederateIdShift +
                    command.counter * gGlobalPriorityBlockSize);
            } else {
                mFederates.back().global_id = GlobalFederateId(
                    static_cast<GlobalFederateId::BaseType>(lookupIndex) + gGlobalFederateIdShift);
            }
            mFederates.addSearchTermForIndex(mFederates.back().global_id, lookupIndex);
        }
    }

    if (!isRootc) {
        if (global_broker_id_local.isValid()) {
            command.source_id = global_broker_id_local;
            transmit(parent_route_id, command);
        } else {
            // delay the response if we are not fully registered yet
            delayTransmitQueue.push(command);
        }
    } else {
        auto route_id = (newFed) ? mFederates.back().route : mFederates.find(fedName)->route;
        auto global_fedid =
            (newFed) ? mFederates.back().global_id : mFederates.find(fedName)->global_id;
        auto res = routing_table.emplace(global_fedid, route_id);
        if (!res.second && !newFed) {
            res.first->second = route_id;
        }

        // don't bother with the federate_table
        // transmit the response
        ActionMessage fedReply(CMD_FED_ACK);
        fedReply.source_id = global_broker_id_local;
        fedReply.dest_id = global_fedid;
        fedReply.name(fedName);
        if (checkActionFlag(command, child_flag)) {
            setActionFlag(fedReply, child_flag);
        }
        if (globalTime || asyncTime) {
            setActionFlag(fedReply, global_timing_flag);
            if (asyncTime) {
                setActionFlag(fedReply, async_timing_flag);
            }
            if (!checkActionFlag(command, non_counting_flag)) {
                timeCoord->addDependency(global_fedid);
                timeCoord->addDependent(global_fedid);
                timeCoord->setAsChild(global_fedid);
            }
        }
        if (globalDisconnect) {
            setActionFlag(fedReply, global_disconnect_flag);
        }
        transmit(route_id, fedReply);
        LOG_CONNECTIONS(global_broker_id_local,
                        getIdentifier(),
                        fmt::format("registering federate {}({}) on route {}",
                                    fedName,
                                    global_fedid.baseValue(),
                                    route_id.baseValue()));
        if (enable_profiling) {
            ActionMessage fedEnableProfiling(CMD_SET_PROFILER_FLAG,
                                             global_broker_id_local,
                                             global_fedid);
            setActionFlag(fedEnableProfiling, indicator_flag);
            transmit(route_id, fedEnableProfiling);
        }
        if (mNextTimeBarrier < Time::maxVal()) {
            ActionMessage timeBarrier(CMD_TIME_BARRIER, global_broker_id_local, global_fedid);
            timeBarrier.actionTime = mNextTimeBarrier;
            timeBarrier.messageID = global_broker_id_local.baseValue();
            transmit(route_id, timeBarrier);
        }
    }
}